

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
FxColorLiteral::FxColorLiteral(FxColorLiteral *this,FArgumentList *args,FScriptPosition *sc)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,sc);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_ColorLiteral;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxColorLiteral_00710d40;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression **)0x0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Most = 0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count = 0;
  this->constval = 0;
  TArray<FxExpression_*,_FxExpression_*>::operator=
            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
             &args->super_TArray<FxExpression_*,_FxExpression_*>);
  return;
}

Assistant:

FxColorLiteral::FxColorLiteral(FArgumentList &args, FScriptPosition &sc)
	:FxExpression(EFX_ColorLiteral, sc)
{
	ArgList = std::move(args);
}